

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_arange(ggml_context *ctx,float start,float stop,float step)

{
  ggml_tensor *tensor;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  ggml_tensor *result;
  int64_t steps;
  undefined8 in_stack_ffffffffffffffd8;
  ggml_type type;
  
  type = (ggml_type)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (in_XMM1_Da <= in_XMM0_Da) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
               ,0x10e1,"GGML_ASSERT(%s) failed","stop > start");
  }
  fVar1 = ceilf((in_XMM1_Da - in_XMM0_Da) / in_XMM2_Da);
  tensor = ggml_new_tensor_1d((ggml_context *)(long)fVar1,type,0x15193b);
  ggml_set_op_params_f32(tensor,0,in_XMM0_Da);
  ggml_set_op_params_f32(tensor,1,in_XMM1_Da);
  ggml_set_op_params_f32(tensor,2,in_XMM2_Da);
  tensor->op = GGML_OP_ARANGE;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_arange(
        struct ggml_context * ctx,
        float                 start,
        float                 stop,
        float                 step) {
    GGML_ASSERT(stop > start);

    const int64_t steps = (int64_t) ceilf((stop - start) / step);

    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, steps);

    ggml_set_op_params_f32(result, 0, start);
    ggml_set_op_params_f32(result, 1, stop);
    ggml_set_op_params_f32(result, 2, step);

    result->op = GGML_OP_ARANGE;

    return result;
}